

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_2,_0>::calcEdgeLogLikelihoodsByPartition
          (BeagleCPUImpl<double,_2,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *categoryWeightsIndices,int *stateFrequenciesIndices,
          int *cumulativeScaleIndices,int *partitionIndices,int partitionCount,
          double *outSumLogLikelihoodByPartition)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  long in_stack_00000008;
  int i_3;
  int k_3;
  double *scalingFactors;
  long in_stack_00000020;
  int i_2;
  double sumOverI;
  int k_2;
  int u;
  double *transMatrixPtr;
  int j;
  double sumOverJB;
  double sumOverJA;
  int i_1;
  double *partialsChildPtr;
  int w_1;
  int k_1;
  double weight_1;
  int u_2;
  int l_1;
  int stateCountModFour;
  int v_1;
  double *partialsChild;
  int i;
  int w;
  int stateChild;
  int k;
  double weight;
  int u_1;
  int l;
  int v;
  int *statesChild;
  double *freqs;
  double *wt;
  double *transMatrix;
  double *partialsParent;
  int scalingFactorsIndex;
  int stateFrequenciesIndex;
  int categoryWeightsIndex;
  int probIndex;
  int childIndex;
  int parIndex;
  int endPattern;
  int startPattern;
  int pIndex;
  int p;
  undefined4 local_128;
  undefined4 local_124;
  undefined4 local_114;
  undefined8 local_110;
  undefined4 local_108;
  undefined4 local_104;
  undefined4 local_f4;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined4 local_dc;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined4 local_b4;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 local_9c;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_34;
  
  for (local_34 = 0; local_34 < (int)scalingFactors; local_34 = local_34 + 1) {
    iVar2 = *(int *)(_i_3 + (long)local_34 * 4);
    local_128 = *(int *)(*(long *)(in_RDI + 0x90) + (long)iVar2 * 4);
    iVar2 = *(int *)(*(long *)(in_RDI + 0x90) + (long)(iVar2 + 1) * 4);
    memset((void *)(*(long *)(in_RDI + 0xe0) + (long)(local_128 * *(int *)(in_RDI + 0x24)) * 8),0,
           (long)((iVar2 - local_128) * *(int *)(in_RDI + 0x24)) << 3);
    iVar3 = *(int *)(in_RDX + (long)local_34 * 4);
    iVar4 = *(int *)(in_stack_00000008 + (long)local_34 * 4);
    lVar5 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)*(int *)(in_RSI + (long)local_34 * 4) * 8);
    lVar6 = *(long *)(*(long *)(in_RDI + 0xd8) + (long)*(int *)(in_RCX + (long)local_34 * 4) * 8);
    lVar7 = *(long *)(*(long *)(in_RDI + 0xa0) + (long)*(int *)(in_R8 + (long)local_34 * 4) * 8);
    lVar8 = *(long *)(*(long *)(in_RDI + 0xa8) + (long)*(int *)(in_R9 + (long)local_34 * 4) * 8);
    if ((iVar3 < *(int *)(in_RDI + 0x10)) &&
       (*(long *)(*(long *)(in_RDI + 0xb8) + (long)iVar3 * 8) != 0)) {
      lVar9 = *(long *)(*(long *)(in_RDI + 0xb8) + (long)iVar3 * 8);
      local_84 = local_128 * *(int *)(in_RDI + 0x2c);
      for (local_88 = 0; local_88 < *(int *)(in_RDI + 0x34); local_88 = local_88 + 1) {
        local_8c = local_128 * *(int *)(in_RDI + 0x24);
        uVar1 = *(ulong *)(lVar7 + (long)local_88 * 8);
        for (local_9c = local_128; local_9c < iVar2; local_9c = local_9c + 1) {
          iVar3 = *(int *)(lVar9 + (long)local_9c * 4);
          local_a4 = local_88 * *(int *)(in_RDI + 0x40);
          for (local_a8 = 0; local_a8 < *(int *)(in_RDI + 0x24); local_a8 = local_a8 + 1) {
            auVar13._8_8_ = 0;
            auVar13._0_8_ = uVar1;
            auVar31._8_8_ = 0;
            auVar31._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_8c * 8);
            auVar22._8_8_ = 0;
            auVar22._0_8_ =
                 *(double *)(lVar6 + (long)(local_a4 + iVar3) * 8) *
                 *(double *)(lVar5 + (long)(local_84 + local_a8) * 8);
            auVar14 = vfmadd213sd_fma(auVar13,auVar22,auVar31);
            *(long *)(*(long *)(in_RDI + 0xe0) + (long)local_8c * 8) = auVar14._0_8_;
            local_8c = local_8c + 1;
            local_a4 = *(int *)(in_RDI + 0x28) + local_a4;
          }
          local_84 = *(int *)(in_RDI + 0x2c) + local_84;
        }
        local_84 = ((*(int *)(in_RDI + 0x14) - iVar2) + local_128) * *(int *)(in_RDI + 0x2c) +
                   local_84;
      }
    }
    else {
      lVar9 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)iVar3 * 8);
      local_b4 = local_128 * *(int *)(in_RDI + 0x2c);
      iVar3 = *(int *)(in_RDI + 0x24);
      for (local_bc = 0; local_bc < *(int *)(in_RDI + 0x34); local_bc = local_bc + 1) {
        local_c0 = local_128 * *(int *)(in_RDI + 0x24);
        uVar1 = *(ulong *)(lVar7 + (long)local_bc * 8);
        for (local_cc = local_128; local_cc < iVar2; local_cc = local_cc + 1) {
          local_d0 = local_bc * *(int *)(in_RDI + 0x40);
          lVar10 = lVar9 + (long)local_b4 * 8;
          for (local_dc = 0; local_dc < *(int *)(in_RDI + 0x24); local_dc = local_dc + 1) {
            local_e8 = 0.0;
            local_f0 = 0.0;
            lVar11 = lVar6 + (long)local_d0 * 8;
            for (local_f4 = 0; local_f4 < iVar3 / 4 << 2; local_f4 = local_f4 + 4) {
              auVar23._8_8_ = 0;
              auVar23._0_8_ = *(ulong *)(lVar11 + (long)local_f4 * 8);
              auVar14._8_8_ = 0;
              auVar14._0_8_ = *(ulong *)(lVar10 + (long)local_f4 * 8);
              auVar32._8_8_ = 0;
              auVar32._0_8_ = local_e8;
              auVar14 = vfmadd213sd_fma(auVar14,auVar23,auVar32);
              auVar24._8_8_ = 0;
              auVar24._0_8_ = *(ulong *)(lVar11 + (long)(local_f4 + 1) * 8);
              auVar15._8_8_ = 0;
              auVar15._0_8_ = *(ulong *)(lVar10 + (long)(local_f4 + 1) * 8);
              auVar33._8_8_ = 0;
              auVar33._0_8_ = local_f0;
              auVar15 = vfmadd213sd_fma(auVar15,auVar24,auVar33);
              auVar25._8_8_ = 0;
              auVar25._0_8_ = *(ulong *)(lVar11 + (long)(local_f4 + 2) * 8);
              auVar16._8_8_ = 0;
              auVar16._0_8_ = *(ulong *)(lVar10 + (long)(local_f4 + 2) * 8);
              auVar34._8_8_ = 0;
              auVar34._0_8_ = auVar14._0_8_;
              auVar14 = vfmadd213sd_fma(auVar16,auVar25,auVar34);
              local_e8 = auVar14._0_8_;
              auVar26._8_8_ = 0;
              auVar26._0_8_ = *(ulong *)(lVar11 + (long)(local_f4 + 3) * 8);
              auVar17._8_8_ = 0;
              auVar17._0_8_ = *(ulong *)(lVar10 + (long)(local_f4 + 3) * 8);
              auVar35._8_8_ = 0;
              auVar35._0_8_ = auVar15._0_8_;
              auVar14 = vfmadd213sd_fma(auVar17,auVar26,auVar35);
              local_f0 = auVar14._0_8_;
            }
            for (; local_f4 < *(int *)(in_RDI + 0x24); local_f4 = local_f4 + 1) {
              auVar27._8_8_ = 0;
              auVar27._0_8_ = *(ulong *)(lVar11 + (long)local_f4 * 8);
              auVar18._8_8_ = 0;
              auVar18._0_8_ = *(ulong *)(lVar10 + (long)local_f4 * 8);
              auVar36._8_8_ = 0;
              auVar36._0_8_ = local_e8;
              auVar14 = vfmadd213sd_fma(auVar18,auVar27,auVar36);
              local_e8 = auVar14._0_8_;
            }
            auVar19._8_8_ = 0;
            auVar19._0_8_ = uVar1;
            auVar37._8_8_ = 0;
            auVar37._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_c0 * 8);
            auVar28._8_8_ = 0;
            auVar28._0_8_ =
                 (local_e8 + local_f0) * *(double *)(lVar5 + (long)(local_b4 + local_dc) * 8);
            auVar14 = vfmadd213sd_fma(auVar19,auVar28,auVar37);
            *(long *)(*(long *)(in_RDI + 0xe0) + (long)local_c0 * 8) = auVar14._0_8_;
            local_c0 = local_c0 + 1;
            local_d0 = *(int *)(in_RDI + 0x24) + local_d0 + 2;
          }
          local_b4 = *(int *)(in_RDI + 0x2c) + local_b4;
        }
        local_b4 = ((*(int *)(in_RDI + 0x14) - iVar2) + local_128) * *(int *)(in_RDI + 0x2c) +
                   local_b4;
      }
    }
    local_104 = local_128 * *(int *)(in_RDI + 0x24);
    for (local_108 = local_128; local_108 < iVar2; local_108 = local_108 + 1) {
      local_110 = 0.0;
      for (local_114 = 0; local_114 < *(int *)(in_RDI + 0x24); local_114 = local_114 + 1) {
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *(ulong *)(lVar8 + (long)local_114 * 8);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_104 * 8);
        auVar38._8_8_ = 0;
        auVar38._0_8_ = local_110;
        auVar14 = vfmadd213sd_fma(auVar20,auVar29,auVar38);
        local_110 = auVar14._0_8_;
        local_104 = local_104 + 1;
      }
      dVar12 = log(local_110);
      *(double *)(*(long *)(in_RDI + 0x110) + (long)local_108 * 8) = dVar12;
    }
    if (iVar4 != -1) {
      lVar5 = *(long *)(*(long *)(in_RDI + 0xc0) + (long)iVar4 * 8);
      for (local_124 = local_128; local_124 < iVar2; local_124 = local_124 + 1) {
        *(double *)(*(long *)(in_RDI + 0x110) + (long)local_124 * 8) =
             *(double *)(lVar5 + (long)local_124 * 8) +
             *(double *)(*(long *)(in_RDI + 0x110) + (long)local_124 * 8);
      }
    }
    *(undefined8 *)(in_stack_00000020 + (long)local_34 * 8) = 0;
    for (; local_128 < iVar2; local_128 = local_128 + 1) {
      auVar30._8_8_ = 0;
      auVar30._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x110) + (long)local_128 * 8);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x80) + (long)local_128 * 8);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = *(ulong *)(in_stack_00000020 + (long)local_34 * 8);
      auVar14 = vfmadd213sd_fma(auVar21,auVar30,auVar39);
      *(long *)(in_stack_00000020 + (long)local_34 * 8) = auVar14._0_8_;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsByPartition(
                                                  const int* parentBufferIndices,
                                                  const int* childBufferIndices,
                                                  const int* probabilityIndices,
                                                  const int* categoryWeightsIndices,
                                                  const int* stateFrequenciesIndices,
                                                  const int* cumulativeScaleIndices,
                                                  const int* partitionIndices,
                                                  int partitionCount,
                                                  double* outSumLogLikelihoodByPartition) {


    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        memset(&integrationTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));

        const int parIndex = parentBufferIndices[p];
        const int childIndex = childBufferIndices[p];
        const int probIndex = probabilityIndices[p];
        const int categoryWeightsIndex = categoryWeightsIndices[p];
        const int stateFrequenciesIndex = stateFrequenciesIndices[p];
        const int scalingFactorsIndex = cumulativeScaleIndices[p];

        assert(parIndex >= kTipCount);

        const REALTYPE* partialsParent = gPartials[parIndex];
        const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
        const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];

        if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child
            const int* statesChild = gTipStates[childIndex];
            int v = startPattern * kPartialsPaddedStateCount; // Index for parent partials

            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * kStateCount; // Index in resulting product-partials (summed over categories)
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {

                    const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                    // so we can interchange the patterCount and categoryCount loop order?
                    int w =  l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        u++;

                        w += kTransPaddedStateCount;
                    }
                    v += kPartialsPaddedStateCount;
                }
                v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            }

        } else { // Integrate against a partial at the child
            const REALTYPE* partialsChild = gPartials[childIndex];
            int v = startPattern * kPartialsPaddedStateCount;
            int stateCountModFour = (kStateCount / 4) * 4;

            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * kStateCount;
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {
                    int w = l * kMatrixSize;
                    const REALTYPE* partialsChildPtr = &partialsChild[v];
                    for(int i = 0; i < kStateCount; i++) {
                        double sumOverJA = 0.0, sumOverJB = 0.0;
                        int j = 0;
                        const REALTYPE* transMatrixPtr = &transMatrix[w];
                        for (; j < stateCountModFour; j += 4) {
                            sumOverJA += transMatrixPtr[j + 0] * partialsChildPtr[j + 0];
                            sumOverJB += transMatrixPtr[j + 1] * partialsChildPtr[j + 1];
                            sumOverJA += transMatrixPtr[j + 2] * partialsChildPtr[j + 2];
                            sumOverJB += transMatrixPtr[j + 3] * partialsChildPtr[j + 3];

                        }
                        for (; j < kStateCount; j++) {
                            sumOverJA += transMatrixPtr[j] * partialsChildPtr[j];
                        }
                        //                        for(int j = 0; j < kStateCount; j++) {
                        //                            sumOverJ += transMatrix[w] * partialsChild[v + j];
                        //                            w++;
                        //                        }
                        integrationTmp[u] += (sumOverJA + sumOverJB) * partialsParent[v + i] * weight;
                        u++;

                        w += kStateCount;

                        // increment for the extra column at the end
                        w += T_PAD;
                    }
                    v += kPartialsPaddedStateCount;
                }
                v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            }
        }

        int u = startPattern * kStateCount;
        for(int k = startPattern; k < endPattern; k++) {
            REALTYPE sumOverI = 0.0;
            for(int i = 0; i < kStateCount; i++) {
                sumOverI += freqs[i] * integrationTmp[u];
                u++;
            }

            outLogLikelihoodsTmp[k] = log(sumOverI);
        }


        if (scalingFactorsIndex != BEAGLE_OP_NONE) {
            const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
            for(int k=startPattern; k < endPattern; k++)
                outLogLikelihoodsTmp[k] += scalingFactors[k];
        }

        outSumLogLikelihoodByPartition[p] = 0.0;
        for (int i = startPattern; i < endPattern; i++) {
            outSumLogLikelihoodByPartition[p] += outLogLikelihoodsTmp[i] * gPatternWeights[i];
        }

    }
}